

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O0

void __thiscall CreditCard::display(CreditCard *this)

{
  ostream *poVar1;
  CreditCard *this_local;
  
  Transaction::display(&this->super_Transaction);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tPayment Method: Credit Card");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tCard Number: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->cardNumber);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tExp. Date: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->expirationDate);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tCVV: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->cvv);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CreditCard::display() const
{
    Transaction::display();

    cout << "\tPayment Method: Credit Card" << endl << "\tCard Number: " << cardNumber << endl << "\tExp. Date: " << expirationDate << endl
        << "\tCVV: " << cvv << endl;
}